

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_MissingFeatureExtensionError_Test::
~CommandLineInterfaceTest_Plugin_MissingFeatureExtensionError_Test
          (CommandLineInterfaceTest_Plugin_MissingFeatureExtensionError_Test *this)

{
  CommandLineInterfaceTest_Plugin_MissingFeatureExtensionError_Test *this_local;
  
  ~CommandLineInterfaceTest_Plugin_MissingFeatureExtensionError_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_MissingFeatureExtensionError) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("no_feature_defaults");
  Run("protocol_compiler --proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring("Test features were not resolved properly");
}